

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::HasProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info,
          bool *pDeclaredProperty,bool *pNonconfigurableProperty)

{
  code *pcVar1;
  DynamicObject *instance_00;
  bool bVar2;
  uint32 index;
  undefined4 *puVar3;
  ScriptContext *this_00;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_01;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  bool *pDeclaredProperty_local;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this_local;
  
  if (propertyId == -1) {
    this_local._4_4_ = 0;
  }
  else {
    descriptor = (SimpleDictionaryPropertyDescriptor<int> *)pDeclaredProperty;
    pDeclaredProperty_local = (bool *)info;
    info_local = (PropertyValueInfo *)noRedecl;
    noRedecl_local._4_4_ = propertyId;
    pDStack_20 = instance;
    instance_local = (DynamicObject *)this;
    if (propertyId == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x447,"(propertyId != Constants::NoProperty)",
                                  "propertyId != Constants::NoProperty");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
    local_50 = ScriptContext::GetPropertyName(this_00,noRedecl_local._4_4_);
    this_01 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    bVar2 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)this_01,&local_50,
                       (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
    if (bVar2) {
      if ((((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject & 0x800) == 0) &&
         (bVar2 = SimpleDictionaryPropertyDescriptor<int>::HasNonLetConstGlobal
                            ((SimpleDictionaryPropertyDescriptor<int> *)propertyRecord), bVar2)) {
        if ((info_local != (PropertyValueInfo *)0x0) &&
           (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0xc000) != 0)) {
          *(undefined1 *)&info_local->m_instance = 1;
        }
        if ((descriptor != (SimpleDictionaryPropertyDescriptor<int> *)0x0) &&
           (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0xe000) != 0)) {
          *(undefined1 *)descriptor = 1;
        }
        if ((pNonconfigurableProperty != (bool *)0x0) &&
           (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0x200) == 0)) {
          *pNonconfigurableProperty = true;
        }
        if ((pDeclaredProperty_local != (bool *)0x0) &&
           (*(int *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject + 4) != -1)) {
          SetPropertyValueInfo
                    (this,(PropertyValueInfo *)pDeclaredProperty_local,
                     &pDStack_20->super_RecyclableObject,
                     (SimpleDictionaryPropertyDescriptor<int> *)propertyRecord);
        }
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      bVar2 = DynamicObject::HasObjectArray(pDStack_20);
      if ((bVar2) && (bVar2 = PropertyRecord::IsNumeric(local_50), instance_00 = pDStack_20, bVar2))
      {
        index = PropertyRecord::GetNumericValue(local_50);
        this_local._4_4_ =
             DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance_00,index);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info && descriptor->propertyIndex != NoSlots)
            {
                SetPropertyValueInfo(info, instance, descriptor);
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }